

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O2

btSpatialMotionVector * __thiscall
btSpatialMotionVector::operator+=(btSpatialMotionVector *this,btSpatialMotionVector *vec)

{
  btVector3::operator+=(&this->m_topVec,&vec->m_topVec);
  btVector3::operator+=(&this->m_bottomVec,&vec->m_bottomVec);
  return this;
}

Assistant:

btSpatialMotionVector & operator += (const btSpatialMotionVector &vec) { m_topVec += vec.m_topVec; m_bottomVec += vec.m_bottomVec; return *this; }